

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explore_eval.cc
# Opt level: O1

base_learner * explore_eval_setup(options_i *options,vw *all)

{
  _func_int **pp_Var1;
  int iVar2;
  explore_eval *dat;
  option_group_definition *this;
  base_learner *l;
  multi_learner *base;
  learner<EXPLORE_EVAL::explore_eval,_std::vector<example_*,_std::allocator<example_*>_>_> *plVar3;
  long lVar4;
  undefined **ppuVar5;
  label_parser *plVar6;
  byte bVar7;
  bool explore_eval_option;
  size_type __dnew_2;
  option_group_definition new_options;
  size_type __dnew;
  size_type __dnew_1;
  bool local_261;
  vw *local_260;
  _func_int ***local_258;
  _func_int **local_250;
  _func_int **local_248 [2];
  float *local_238;
  long local_230;
  _func_int ***local_228;
  _func_int **local_220;
  _func_int **local_218 [2];
  option_group_definition local_208;
  long *local_1d0;
  long local_1c8;
  long local_1c0 [2];
  undefined1 local_1b0 [112];
  bool local_140;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_128;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_118;
  string local_110;
  string local_f0;
  undefined1 local_d0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  bVar7 = 0;
  local_260 = all;
  dat = calloc_or_throw<EXPLORE_EVAL::explore_eval>(1);
  (dat->known_cost).cost = 0.0;
  (dat->known_cost).action = 0;
  (dat->known_cost).probability = 0.0;
  (dat->known_cost).partial_prediction = 0.0;
  dat->all = (vw *)0x0;
  dat->offset = 0;
  (dat->action_label).costs._begin = (cb_class *)0x0;
  (dat->action_label).costs._end = (cb_class *)0x0;
  (dat->action_label).costs.end_array = (cb_class *)0x0;
  (dat->action_label).costs.erase_count = 0;
  (dat->empty_label).costs._begin = (cb_class *)0x0;
  (dat->empty_label).costs._end = (cb_class *)0x0;
  (dat->empty_label).costs.end_array = (cb_class *)0x0;
  (dat->empty_label).costs.erase_count = 0;
  dat->example_counter = 0;
  dat->update_count = 0;
  dat->violations = 0;
  dat->multiplier = 0.0;
  dat->fixed_multiplier = false;
  *(undefined3 *)&dat->field_0x7d = 0;
  local_261 = false;
  local_1b0._0_8_ = (_func_int **)0x12;
  local_258 = local_248;
  local_258 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_258,(ulong)local_1b0);
  local_248[0] = (_func_int **)local_1b0._0_8_;
  *(undefined4 *)local_258 = 0x6c707845;
  builtin_strncpy((char *)((long)local_258 + 4),"ore ",4);
  *(undefined4 *)(local_258 + 1) = 0x6c617665;
  builtin_strncpy((char *)((long)local_258 + 0xc),"uati",4);
  *(undefined2 *)(local_258 + 2) = 0x6e6f;
  local_250 = (_func_int **)local_1b0._0_8_;
  *(char *)((long)local_258 + local_1b0._0_8_) = '\0';
  local_208.m_name._M_dataplus._M_p = (pointer)&local_208.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,local_258,(char *)(local_1b0._0_8_ + (long)local_258));
  local_208.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_258 != local_248) {
    operator_delete(local_258);
  }
  local_f0.field_2._M_allocated_capacity = 0x5f65726f6c707865;
  local_f0.field_2._8_4_ = 0x6c617665;
  local_f0._M_string_length = 0xc;
  local_f0.field_2._M_local_buf[0xc] = '\0';
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)local_1b0,&local_f0,&local_261)
  ;
  local_140 = true;
  local_228 = local_218;
  local_d0._0_8_ = (_func_int **)0x22;
  local_228 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_228,(ulong)local_d0);
  local_218[0] = (_func_int **)local_d0._0_8_;
  local_228[2] = (_func_int **)0x6461206c6176655f;
  local_228[3] = (_func_int **)0x6963696c6f702066;
  *local_228 = (_func_int **)0x657461756c617645;
  local_228[1] = (_func_int **)0x65726f6c70786520;
  *(undefined2 *)(local_228 + 4) = 0x7365;
  local_220 = (_func_int **)local_d0._0_8_;
  *(char *)((long)local_228 + local_d0._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_1b0 + 0x30));
  this = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                   (&local_208,(typed_option<bool> *)local_1b0);
  local_110.field_2._M_allocated_capacity = 0x696c7069746c756d;
  local_110.field_2._8_2_ = 0x7265;
  local_110._M_string_length = 10;
  local_110.field_2._M_local_buf[10] = '\0';
  local_238 = &dat->multiplier;
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_d0,&local_110,local_238);
  local_230 = 0x3f;
  local_1d0 = local_1c0;
  local_1d0 = (long *)std::__cxx11::string::_M_create((ulong *)&local_1d0,(ulong)&local_230);
  local_1c0[0] = local_230;
  builtin_strncpy((char *)((long)local_1d0 + 0x2f),"obabilit",8);
  builtin_strncpy((char *)((long)local_1d0 + 0x37),"ies <= 1",8);
  local_1d0[4] = 0x6173206e6f697463;
  local_1d0[5] = 0x6f727020656c706d;
  local_1d0[2] = 0x20656b616d206f74;
  local_1d0[3] = 0x656a6572206c6c61;
  *local_1d0 = 0x696c7069746c754d;
  local_1d0[1] = 0x2064657375207265;
  local_1c8 = local_230;
  *(char *)((long)local_1d0 + local_230) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_d0 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (this,(typed_option<float> *)local_d0);
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0);
  }
  local_d0._0_8_ = &PTR__typed_option_002d8610;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if (local_228 != local_218) {
    operator_delete(local_228);
  }
  local_1b0._0_8_ = &PTR__typed_option_002d8500;
  if (local_118._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118._M_pi);
  }
  if (local_128._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_128._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_208);
  if (local_261 == false) {
    plVar3 = (learner<EXPLORE_EVAL::explore_eval,_std::vector<example_*,_std::allocator<example_*>_>_>
              *)0x0;
  }
  else {
    dat->all = local_260;
    pp_Var1 = (_func_int **)(local_1b0 + 0x10);
    local_1b0._16_6_ = 0x7069746c756d;
    local_1b0._22_2_ = 0x696c;
    local_1b0._24_2_ = 0x7265;
    local_1b0._8_8_ = (pointer)0xa;
    local_1b0._26_4_ = local_1b0._26_4_ & 0xffffff00;
    local_1b0._0_8_ = pp_Var1;
    iVar2 = (*options->_vptr_options_i[1])(options,local_1b0);
    if ((_func_int **)local_1b0._0_8_ != pp_Var1) {
      operator_delete((void *)local_1b0._0_8_);
    }
    if ((char)iVar2 == '\0') {
      *local_238 = 1.0;
    }
    else {
      dat->fixed_multiplier = true;
    }
    local_1b0._16_6_ = 0x7078655f6263;
    local_1b0._22_2_ = 0x6f6c;
    local_1b0._24_2_ = 0x6572;
    local_1b0._26_4_ = 0x6664615f;
    local_1b0._8_8_ = (pointer)0xe;
    local_1b0[0x1e] = '\0';
    local_1b0._0_8_ = pp_Var1;
    iVar2 = (*options->_vptr_options_i[1])(options);
    if ((_func_int **)local_1b0._0_8_ != pp_Var1) {
      operator_delete((void *)local_1b0._0_8_);
    }
    if ((char)iVar2 == '\0') {
      local_1b0._16_6_ = 0x7078655f6263;
      local_1b0._22_2_ = 0x6f6c;
      local_1b0._24_2_ = 0x6572;
      local_1b0._26_4_ = 0x6664615f;
      local_1b0._8_8_ = (pointer)0xe;
      local_1b0[0x1e] = '\0';
      local_d0._8_8_ = (pointer)0x0;
      local_d0[0x10] = 0;
      local_1b0._0_8_ = pp_Var1;
      local_d0._0_8_ = local_d0 + 0x10;
      (*options->_vptr_options_i[5])(options,local_1b0,local_d0);
      if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
        operator_delete((void *)local_d0._0_8_);
      }
      if ((_func_int **)local_1b0._0_8_ != pp_Var1) {
        operator_delete((void *)local_1b0._0_8_);
      }
    }
    local_260->delete_prediction = (_func_void_void_ptr *)0x0;
    l = setup_base(options,local_260);
    base = LEARNER::as_multiline<char,char>(l);
    ppuVar5 = &CB::cb_label;
    plVar6 = &local_260->p->lp;
    for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
      plVar6->default_label = (_func_void_void_ptr *)*ppuVar5;
      ppuVar5 = ppuVar5 + (ulong)bVar7 * -2 + 1;
      plVar6 = (label_parser *)((long)plVar6 + (ulong)bVar7 * -0x10 + 8);
    }
    local_260->label_type = cb;
    plVar3 = LEARNER::
             learner<EXPLORE_EVAL::explore_eval,std::vector<example*,std::allocator<example*>>>::
             init_learner<LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                       (dat,base,EXPLORE_EVAL::do_actual_learning<true>,
                        EXPLORE_EVAL::do_actual_learning<false>,1,action_probs);
    *(undefined8 *)(plVar3 + 0x58) = *(undefined8 *)(plVar3 + 0x18);
    *(code **)(plVar3 + 0x68) = EXPLORE_EVAL::finish_multiline_example;
    *(undefined8 *)(plVar3 + 0xb8) = *(undefined8 *)(plVar3 + 0x18);
    *(undefined8 *)(plVar3 + 0xc0) = *(undefined8 *)(plVar3 + 0x20);
    *(code **)(plVar3 + 200) = EXPLORE_EVAL::finish;
    dat = (explore_eval *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_208.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.m_name._M_dataplus._M_p != &local_208.m_name.field_2) {
    operator_delete(local_208.m_name._M_dataplus._M_p);
  }
  if (dat != (explore_eval *)0x0) {
    free(dat);
  }
  return (base_learner *)plVar3;
}

Assistant:

base_learner* explore_eval_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<explore_eval>();
  bool explore_eval_option = false;
  option_group_definition new_options("Explore evaluation");
  new_options.add(make_option("explore_eval", explore_eval_option).keep().help("Evaluate explore_eval adf policies"))
      .add(make_option("multiplier", data->multiplier)
               .help("Multiplier used to make all rejection sample probabilities <= 1"));
  options.add_and_parse(new_options);

  if (!explore_eval_option)
    return nullptr;

  data->all = &all;

  if (options.was_supplied("multiplier"))
    data->fixed_multiplier = true;
  else
    data->multiplier = 1;

  if (!options.was_supplied("cb_explore_adf"))
    options.insert("cb_explore_adf", "");

  all.delete_prediction = nullptr;

  multi_learner* base = as_multiline(setup_base(options, all));
  all.p->lp = CB::cb_label;
  all.label_type = label_type::cb;

  learner<explore_eval, multi_ex>& l =
      init_learner(data, base, do_actual_learning<true>, do_actual_learning<false>, 1, prediction_type::action_probs);

  l.set_finish_example(finish_multiline_example);
  l.set_finish(finish);
  return make_base(l);
}